

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O1

void __thiscall
MADPComponentDiscreteStates::AddState(MADPComponentDiscreteStates *this,string *StateName)

{
  pointer pdVar1;
  pointer pSVar2;
  pointer pSVar3;
  size_t sVar4;
  iterator __position;
  StateDistributionVector *pSVar5;
  pointer pSVar6;
  string local_a0;
  StateDiscrete local_80;
  
  if (this->_m_initialStateDistribution == (StateDistributionVector *)0x0) {
    pSVar5 = (StateDistributionVector *)operator_new(0x20);
    (pSVar5->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar5->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar5->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pSVar5->super_StateDistribution)._vptr_StateDistribution =
         (_func_int **)&PTR__StateDistributionVector_0059cb98;
    this->_m_initialStateDistribution = pSVar5;
  }
  if (this->_m_initialized == false) {
    this->_m_nrStates = 0;
    pSVar5 = this->_m_initialStateDistribution;
    pdVar1 = (pSVar5->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((pSVar5->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar1) {
      (pSVar5->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar1;
    }
    pSVar2 = (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pSVar3 = (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pSVar6 = pSVar2;
    if (pSVar3 != pSVar2) {
      do {
        (**(pSVar6->super_State).super_NamedDescribedEntity._vptr_NamedDescribedEntity)(pSVar6);
        pSVar6 = pSVar6 + 1;
      } while (pSVar6 != pSVar3);
      (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>._M_impl.
      super__Vector_impl_data._M_finish = pSVar2;
    }
    this->_m_initialized = true;
  }
  sVar4 = this->_m_nrStates;
  this->_m_nrStates = sVar4 + 1;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"undefined","");
  NamedDescribedEntity::NamedDescribedEntity((NamedDescribedEntity *)&local_80,StateName,&local_a0);
  local_80.super_DiscreteEntity._m_index = (Index)sVar4;
  local_80.super_State.super_NamedDescribedEntity._vptr_NamedDescribedEntity =
       (_func_int **)&PTR__StateDiscrete_005d0d38;
  local_80.super_DiscreteEntity._vptr_DiscreteEntity = (_func_int **)&PTR__StateDiscrete_005d0d68;
  std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::emplace_back<StateDiscrete>
            (&this->_m_stateVec,&local_80);
  NamedDescribedEntity::~NamedDescribedEntity((NamedDescribedEntity *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  pSVar5 = this->_m_initialStateDistribution;
  local_80.super_State.super_NamedDescribedEntity._vptr_NamedDescribedEntity = (_func_int **)0x0;
  __position._M_current =
       (pSVar5->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pSVar5->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&pSVar5->super_SDV,__position,(double *)&local_80);
  }
  else {
    *__position._M_current = 0.0;
    (pSVar5->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void MADPComponentDiscreteStates::AddState(const string &StateName)
{
    if(_m_initialStateDistribution == 0)
        _m_initialStateDistribution = new StateDistributionVector();
    
    if(!_m_initialized)
    {
        _m_nrStates=0;    
        _m_initialStateDistribution->clear();
        _m_stateVec.clear();

        _m_initialized = true;
    }        
    _m_stateVec.push_back(StateDiscrete( _m_nrStates++, StateName));
    _m_initialStateDistribution->push_back(0.0);
//    _m_nrStates++; - already done...
}